

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O0

int lwsws_get_config_globals(lws_context_creation_info *info,char *d,char **cs,int *len)

{
  int iVar1;
  bool bVar2;
  char local_1b8 [8];
  char dd [128];
  char **old;
  jpargs a;
  lws_dir_args da;
  int *len_local;
  char **cs_local;
  char *d_local;
  lws_context_creation_info *info_local;
  
  dd._120_8_ = info->plugin_dirs;
  memset(&old,0,0xe0);
  a.extensions = (lws_extension *)*cs;
  a.p = (char *)((long)a.extensions + (long)*len + -1);
  a.end._0_1_ = 0;
  old = (char **)info;
  lwsws_align((jpargs *)&old);
  info->plugin_dirs = &(a.extensions)->name;
  a.m._unused[1] = a.extensions;
  while( true ) {
    bVar2 = false;
    if (dd._120_8_ != 0) {
      bVar2 = *(long *)dd._120_8_ != 0;
    }
    if (!bVar2) break;
    (&(a.extensions)->name)[(int)a.plugin_dirs] = *(char **)dd._120_8_;
    dd._120_8_ = dd._120_8_ + 8;
    a.plugin_dirs._0_4_ = (int)a.plugin_dirs + 1;
  }
  a.extensions = (lws_extension *)&a.extensions[3].callback;
  lws_snprintf(local_1b8,0x7f,"%s/conf",d);
  iVar1 = lwsws_get_config(&old,local_1b8,paths_global,0xf,lejp_globals_cb);
  if (iVar1 < 2) {
    lws_snprintf(local_1b8,0x7f,"%s/conf.d",d);
    a._216_8_ = &old;
    iVar1 = lws_dir(local_1b8,&a.count_plugin_dirs,lwsws_get_config_d_cb);
    if (iVar1 < 2) {
      *(undefined8 *)((long)a.m._unused[1] + (long)(int)a.plugin_dirs * 8) = 0;
      *cs = (char *)a.extensions;
      *len = (int)a.p - (int)a.extensions;
      info_local._4_4_ = 0;
    }
    else {
      info_local._4_4_ = 1;
    }
  }
  else {
    info_local._4_4_ = 1;
  }
  return info_local._4_4_;
}

Assistant:

int
lwsws_get_config_globals(struct lws_context_creation_info *info, const char *d,
			 char **cs, int *len)
{
	struct lws_dir_args da;
	struct jpargs a;
	const char * const *old = info->plugin_dirs;
	char dd[128];

	memset(&a, 0, sizeof(a));

	a.info = info;
	a.p = *cs;
	a.end = (a.p + *len) - 1;
	a.valid = 0;

	lwsws_align(&a);
	info->plugin_dirs = (void *)a.p;
	a.plugin_dirs = (void *)a.p; /* writeable version */
	a.p += MAX_PLUGIN_DIRS * sizeof(void *);

	/* copy any default paths */

	while (old && *old) {
		a.plugin_dirs[a.count_plugin_dirs++] = *old;
		old++;
	}

	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf", d);
	if (lwsws_get_config(&a, dd, paths_global,
			     LWS_ARRAY_SIZE(paths_global), lejp_globals_cb) > 1)
		return 1;
	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf.d", d);

	da.user = &a;
	da.paths = paths_global;
	da.count_paths = LWS_ARRAY_SIZE(paths_global),
	da.cb = lejp_globals_cb;

	if (lws_dir(dd, &da, lwsws_get_config_d_cb) > 1)
		return 1;

	a.plugin_dirs[a.count_plugin_dirs] = NULL;

	*cs = a.p;
	*len = lws_ptr_diff(a.end, a.p);

	return 0;
}